

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_info.cpp
# Opt level: O0

HTTPResponse * http_request_handler(Client *client)

{
  bool bVar1;
  HTTPResponse *this;
  size_type __val;
  list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *plVar2;
  unsigned_long __val_00;
  tuple<const_char_*,_const_char_*> local_550;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_540;
  string local_500;
  tuple<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4e0;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4b8;
  tuple<const_char_*,_const_char_*> local_478;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  tuple<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_408;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e0;
  tuple<const_char_*,_const_char_*> local_3a0;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_390;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  HTTPResponse *local_20;
  HTTPResponse *response;
  Client *client_local;
  
  response = (HTTPResponse *)client;
  bVar1 = match_path<p,_5>((string *)(client + 0x20));
  if (bVar1) {
    this = (HTTPResponse *)operator_new(0x98);
    HTTPResponse::HTTPResponse(this);
    local_20 = this;
    std::__cxx11::string::operator=((string *)this,"HTTP/1.1");
    std::__cxx11::string::operator=((string *)(local_20 + 0x20),"200 OK");
    std::operator+(&local_270,
                   "<!DOCTYPE html><html><head><link rel=\"stylesheet\" type=\"text/css\" href=\"/static/nice.css\" media=\"screen\"/><script src=\"/static/nice.js\"></script></head><title>System Information</title><body><h1>System Information</h1><div class=\"entry\"><input type=\"button\" value=\"Kernel Version\" class=\"button\" onclick=\"ToggleBetweenDisplayAndHide(\'KernelVersion\')\"/><div id=\"KernelVersion\" class=\"hide\"><div class=\"text\">"
                   ,&version_abi_cxx11_);
    std::operator+(&local_250,&local_270,
                   "</div></div></div><div class=\"entry\"><input type=\"button\" value=\"Memory Status\" class=\"button\" onclick=\"ToggleBetweenDisplayAndHide(\'MemoryUsage\')\"/><div id=\"MemoryUsage\" class=\"hide\"><table id=\"MemoryUsageTable\" class=\"table\" border=\"0\" style=\"width: 40%\"><tr><th align=\"left\">Total</th><td align=\"right\">"
                  );
    std::__cxx11::to_string(&local_290,mem_total >> 10);
    std::operator+(&local_230,&local_250,&local_290);
    std::operator+(&local_210,&local_230,
                   " MiB</td></tr><tr><th align=\"left\">Free</th><td align=\"right\">");
    std::__cxx11::to_string(&local_2b0,mem_free >> 10);
    std::operator+(&local_1f0,&local_210,&local_2b0);
    std::operator+(&local_1d0,&local_1f0,
                   " MiB</td></tr><tr><th align=\"left\">Available</th><td align=\"right\">");
    std::__cxx11::to_string(&local_2d0,mem_available >> 10);
    std::operator+(&local_1b0,&local_1d0,&local_2d0);
    std::operator+(&local_190,&local_1b0,
                   " MiB</td></tr></table></div></div><div class=\"entry\"><input type=\"button\" value=\"Disk Status\" class=\"button\" onclick=\"ToggleBetweenDisplayAndHide(\'DiskStatus\')\"/><div id=\"DiskStatus\" class=\"hide\"><table class=\"table\" border=\"0\" style=\"width: 40%\"><tr><th align=\"left\">Capacity</th><td align=\"right\">"
                  );
    std::__cxx11::to_string(&local_2f0,disk_info.capacity >> 0x14);
    std::operator+(&local_170,&local_190,&local_2f0);
    std::operator+(&local_150,&local_170,
                   " MiB</td></tr><tr><th align=\"left\">Free</th><td align=\"right\">");
    std::__cxx11::to_string(&local_310,disk_info.free >> 0x14);
    std::operator+(&local_130,&local_150,&local_310);
    std::operator+(&local_110,&local_130,
                   " MiB</td></tr><tr><th align=\"left\">Available</th><td align=\"right\">");
    std::__cxx11::to_string(&local_330,disk_info.available >> 0x14);
    std::operator+(&local_f0,&local_110,&local_330);
    std::operator+(&local_d0,&local_f0,
                   " MiB</td></tr></table></div></div><div class=\"entry\"><input type=\"button\" value=\"Processes Status\" class=\"button\" onclick=\"ToggleBetweenDisplayAndHide(\'ProcessesStatus\')\"/><div id=\"ProcessesStatus\" class=\"hide\"><table class=\"table\" border=\"0\" style=\"width: 40%\"><tr><th align=\"left\">Total</th><td align=\"right\">"
                  );
    __val = std::
            vector<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size(&processes_info_abi_cxx11_);
    std::__cxx11::to_string(&local_350,__val);
    std::operator+(&local_b0,&local_d0,&local_350);
    std::operator+(&local_90,&local_b0,
                   "</td></tr><tr><th align=\"left\">PID</th><td align=\"right\">NAME</td></tr>");
    std::operator+(&local_70,&local_90,&processes_data_abi_cxx11_);
    std::operator+(&local_50,&local_70,
                   "</table></div></div><div class=\"text\" align=\"right\">&hearts; Fugoes</div></body></html>"
                  );
    std::__cxx11::string::operator=((string *)(local_20 + 0x58),(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    plVar2 = (list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_20 + 0x40);
    std::make_tuple<char_const(&)[7],char_const(&)[9]>
              ((char (*) [7])&local_3a0,(char (*) [9])"Server");
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::tuple<const_char_*,_const_char_*,_true>(&local_390,&local_3a0);
    std::__cxx11::
    list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(plVar2,&local_390);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple(&local_390);
    plVar2 = (list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_20 + 0x40);
    HTTPResponse::date_abi_cxx11_();
    std::make_tuple<char_const(&)[5],std::__cxx11::string>
              (&local_408,(char (*) [5])"Date",&local_428);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    tuple<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_3e0,&local_408);
    std::__cxx11::
    list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(plVar2,&local_3e0);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple(&local_3e0);
    std::
    tuple<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple(&local_408);
    std::__cxx11::string::~string((string *)&local_428);
    plVar2 = (list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_20 + 0x40);
    std::make_tuple<char_const(&)[13],char_const(&)[10]>
              ((char (*) [13])&local_478,(char (*) [10])"Content-Type");
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::tuple<const_char_*,_const_char_*,_true>(&local_468,&local_478);
    std::__cxx11::
    list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(plVar2,&local_468);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple(&local_468);
    plVar2 = (list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_20 + 0x40);
    __val_00 = std::__cxx11::string::size();
    std::__cxx11::to_string(&local_500,__val_00);
    std::make_tuple<char_const(&)[15],std::__cxx11::string>
              (&local_4e0,(char (*) [15])"Content-Length",&local_500);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    tuple<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_4b8,&local_4e0);
    std::__cxx11::
    list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(plVar2,&local_4b8);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple(&local_4b8);
    std::
    tuple<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple(&local_4e0);
    std::__cxx11::string::~string((string *)&local_500);
    plVar2 = (list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_20 + 0x40);
    std::make_tuple<char_const(&)[11],char_const(&)[11]>
              ((char (*) [11])&local_550,(char (*) [11])"Connection");
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::tuple<const_char_*,_const_char_*,_true>(&local_540,&local_550);
    std::__cxx11::
    list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(plVar2,&local_540);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple(&local_540);
    client_local = (Client *)local_20;
  }
  else {
    client_local = (Client *)0x0;
  }
  return (HTTPResponse *)client_local;
}

Assistant:

static HTTPResponse *http_request_handler(Client *client) {
    if (match_path<p, 5>(client->request.uri)) {
        auto response = new HTTPResponse();
        response->version = "HTTP/1.1";
        response->status = "200 OK";
        response->data = \
                "<!DOCTYPE html>" \
                "<html>" \
                "<head>" \
                "<link rel=\"stylesheet\" type=\"text/css\" href=\"/static/nice.css\" media=\"screen\"/>" \
                "<script src=\"/static/nice.js\"></script>" \
                "</head>" \
                "<title>System Information</title>" \
                "<body>" \
                "<h1>System Information</h1>" \
                  "<div class=\"entry\">" \
                    "<input type=\"button\" value=\"Kernel Version\" class=\"button\" onclick=\"ToggleBetweenDisplayAndHide('KernelVersion')\"/>" \
                    "<div id=\"KernelVersion\" class=\"hide\">" \
                    "<div class=\"text\">" + version + \
                    "</div>" \
                    "</div>" \
                  "</div>" \
                  "<div class=\"entry\">" \
                    "<input type=\"button\" value=\"Memory Status\" class=\"button\" onclick=\"ToggleBetweenDisplayAndHide('MemoryUsage')\"/>" \
                    "<div id=\"MemoryUsage\" class=\"hide\">" \
                    "<table id=\"MemoryUsageTable\" class=\"table\" border=\"0\" style=\"width: 40%\">" \
                    "<tr><th align=\"left\">Total</th><td align=\"right\">" + std::to_string(mem_total / 1024) + " MiB</td></tr>" \
                    "<tr><th align=\"left\">Free</th><td align=\"right\">" + std::to_string(mem_free / 1024) + " MiB</td></tr>" \
                    "<tr><th align=\"left\">Available</th><td align=\"right\">" + std::to_string(mem_available / 1024) + " MiB</td></tr>" \
                    "</table>" \
                    "</div>" \
                  "</div>" \
                  "<div class=\"entry\">" \
                    "<input type=\"button\" value=\"Disk Status\" class=\"button\" onclick=\"ToggleBetweenDisplayAndHide('DiskStatus')\"/>" \
                    "<div id=\"DiskStatus\" class=\"hide\">" \
                    "<table class=\"table\" border=\"0\" style=\"width: 40%\">" \
                    "<tr><th align=\"left\">Capacity</th><td align=\"right\">" + std::to_string(disk_info.capacity / 1024 / 1024) + " MiB</td></tr>" \
                    "<tr><th align=\"left\">Free</th><td align=\"right\">" + std::to_string(disk_info.free / 1024 / 1024) + " MiB</td></tr>" \
                    "<tr><th align=\"left\">Available</th><td align=\"right\">" + std::to_string(disk_info.available / 1024 / 1024) + " MiB</td></tr>" \
                    "</table>" \
                    "</div>" \
                  "</div>" \
                  "<div class=\"entry\">" \
                    "<input type=\"button\" value=\"Processes Status\" class=\"button\" onclick=\"ToggleBetweenDisplayAndHide('ProcessesStatus')\"/>" \
                    "<div id=\"ProcessesStatus\" class=\"hide\">" \
                    "<table class=\"table\" border=\"0\" style=\"width: 40%\">" \
                    "<tr><th align=\"left\">Total</th><td align=\"right\">" + std::to_string(processes_info.size()) + "</td></tr>" \
                    "<tr><th align=\"left\">PID</th><td align=\"right\">NAME</td></tr>" \
                    + processes_data + "</table>" \
                    "</div>" \
                  "</div>" \
                "<div class=\"text\" align=\"right\">" \
                "&hearts; Fugoes" \
                "</div>"
                "</body>" \
                "</html>";

        response->header.push_back(std::make_tuple("Server", "Webe/0.1"));
        response->header.push_back(std::make_tuple("Date", HTTPResponse::date()));
        response->header.push_back(std::make_tuple("Content-Type", "text/html"));
        response->header.push_back(std::make_tuple("Content-Length", std::to_string(response->data.size())));
        response->header.push_back(std::make_tuple("Connection", "keep-alive"));
        return response;
    } else {
        return nullptr;
    }
}